

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O2

int mapLandB18(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint64_t ss;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  uint64_t uVar11;
  int iVar12;
  long lVar13;
  int *piVar14;
  long lVar15;
  int *piVar16;
  int *piVar17;
  int *piVar18;
  int z_00;
  ulong uVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  
  iVar1 = w + 2;
  iVar7 = (*l->p->getMap)(l->p,out,x + -1,z + -1,iVar1,h + 2);
  if (iVar7 == 0) {
    ss = l->startSeed;
    lVar9 = (long)w;
    lVar15 = 0;
    if (0 < lVar9) {
      lVar15 = lVar9;
    }
    if (h < 1) {
      h = 0;
    }
    piVar16 = out + lVar9 + 3;
    piVar17 = out + lVar9 * 2 + 6;
    piVar14 = out;
    piVar18 = out;
    uVar19 = 0;
    while (uVar19 != (uint)h) {
      lVar10 = uVar19 * (long)iVar1;
      lVar13 = (uVar19 + 2) * (long)iVar1;
      z_00 = (int)uVar19 + z;
      iVar7 = out[lVar10];
      iVar20 = out[lVar10 + 1];
      iVar8 = out[lVar13];
      iVar22 = out[lVar13 + 1];
      for (lVar21 = 0; lVar15 != lVar21; lVar21 = lVar21 + 1) {
        iVar12 = piVar16[lVar21];
        iVar2 = piVar18[lVar21 + 2];
        iVar3 = piVar17[lVar21];
        if (iVar12 == 1) {
          if (((iVar7 == 1) && (iVar8 == 1)) && (iVar2 == 1)) {
            iVar12 = 1;
            if (iVar3 == 1) goto LAB_001167cb;
          }
          uVar11 = getChunkSeed(ss,x + (int)lVar21,z_00);
          auVar5._8_8_ = (long)uVar11 >> 0x3f;
          auVar5._0_8_ = (long)uVar11 >> 0x18;
          cVar6 = (char)((SUB161(auVar5 % SEXT816(5),7) >> 7 & 5U) + SUB161(auVar5 % SEXT816(5),0))
                  / -4 + '\x01';
LAB_001167c8:
          iVar12 = (int)cVar6;
        }
        else if ((iVar12 == 0) &&
                (((iVar7 != 0 || (iVar8 != 0)) || ((iVar2 != 0 || (iVar12 = 0, iVar3 != 0)))))) {
          uVar11 = getChunkSeed(ss,x + (int)lVar21,z_00);
          auVar4._8_8_ = (long)uVar11 >> 0x3f;
          auVar4._0_8_ = (long)uVar11 >> 0x18;
          cVar6 = (char)((SUB161(auVar4 % SEXT816(3),7) >> 7 & 3U) + SUB161(auVar4 % SEXT816(3),0))
                  / '\x02';
          goto LAB_001167c8;
        }
LAB_001167cb:
        piVar14[lVar21] = iVar12;
        iVar7 = iVar20;
        iVar20 = iVar2;
        iVar8 = iVar22;
        iVar22 = iVar3;
      }
      piVar14 = piVar14 + lVar9;
      piVar16 = piVar16 + lVar9 + 2;
      piVar17 = piVar17 + lVar9 + 2;
      piVar18 = piVar18 + lVar9 + 2;
      uVar19 = uVar19 + 1;
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int mapLandB18(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, (int)pW, (int)pH);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    for (j = 0; j < h; j++)
    {
        int *vz0 = out + (j+0)*pW;
        int *vz1 = out + (j+1)*pW;
        int *vz2 = out + (j+2)*pW;

        int v00 = vz0[0], vt0 = vz0[1];
        int v02 = vz2[0], vt2 = vz2[1];
        int v20, v22;
        int v11, v;

        for (i = 0; i < w; i++)
        {
            v11 = vz1[i+1];
            v20 = vz0[i+2];
            v22 = vz2[i+2];
            v = v11;

            if (v11 == 0 && (v00 != 0 || v02 != 0 || v20 != 0 || v22 != 0))
            {
                cs = getChunkSeed(ss, i+x, j+z);
                v = mcFirstInt(cs, 3) / 2;
            }
            else if (v11 == 1 && (v00 != 1 || v02 != 1 || v20 != 1 || v22 != 1))
            {
                cs = getChunkSeed(ss, i+x, j+z);
                v = 1 - mcFirstInt(cs, 5) / 4;
            }

            out[i + j*w] = v;
            v00 = vt0; vt0 = v20;
            v02 = vt2; vt2 = v22;
        }
    }

    return 0;
}